

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O2

int arguments(int isPrototype,object *proc,int parBlkSize)

{
  int iVar1;
  uint uVar2;
  char *msg;
  
  uVar2 = currentSymbol - 0x25e;
  iVar1 = 0;
  if (uVar2 < 0x10) {
    if ((0x840aU >> (uVar2 & 0x1f) & 1) != 0) {
      if (isPrototype == 1) {
        proc->hasArguments = 1;
      }
      else if ((proc->hasArguments == 0) && (proc->hasPrototype == 1)) {
        msg = "prototype requires void";
LAB_00105db4:
        mark(msg);
        exit(-1);
      }
      iVar1 = argumentList(isPrototype,proc,parBlkSize);
      return iVar1;
    }
    iVar1 = 0;
    if (uVar2 == 0) {
      getSymbol();
      iVar1 = parBlkSize;
      if (isPrototype == 1) {
        proc->hasArguments = 0;
      }
      else if (proc->hasArguments == 1) {
        msg = "prototype requires at least one argument";
        goto LAB_00105db4;
      }
    }
  }
  return iVar1;
}

Assistant:

procedure 
int arguments(int isPrototype, struct object *proc, int parBlkSize) {
	variable int parSize;
	variable struct object *first;
	parSize = 0; first = NULL;
	if (currentSymbol == SYMBOL_VOID) {
		getSymbol();
		if (isPrototype == 1) {
			proc->hasArguments = false;
		} else {
			if (proc->hasArguments == true) {
				mark("prototype requires at least one argument");
				exit(-1);
			}
		}
		parSize = parBlkSize + 0;
	} elsif ((currentSymbol == SYMBOL_INT) || (currentSymbol == SYMBOL_CHAR)  || 
		(currentSymbol == SYMBOL_BOOL) || (currentSymbol == SYMBOL_STRUCT)) {
			if (isPrototype == 1 ) {
				proc->hasArguments = true;
			} else {
				if ((proc->hasArguments == false) && (proc->hasPrototype == true)) {
					mark("prototype requires void");
					exit(-1);
				}
			}
			parSize = argumentList(isPrototype,proc,parBlkSize);
	}
	return parSize;
}